

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O2

Flow * __thiscall
wasm::PrecomputingExpressionRunner::visitArrayGet
          (Flow *__return_storage_ptr__,PrecomputingExpressionRunner *this,ArrayGet *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  HeapType local_40;
  int local_34;
  uintptr_t local_30;
  
  if (((curr->ref->type).id != 1) && (bVar3 = wasm::Type::isNull(&curr->ref->type), !bVar3)) {
    local_30 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
    HeapType::getArray(&local_40);
    if (local_34 == 0) {
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayGet
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,curr);
      return __return_storage_ptr__;
    }
  }
  uVar2 = NONCONSTANT_FLOW._8_8_;
  uVar1 = NONCONSTANT_FLOW._0_8_;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayGet(ArrayGet* curr) {
    if (curr->ref->type != Type::unreachable && !curr->ref->type.isNull()) {
      // See above with struct.get
      auto element = curr->ref->type.getHeapType().getArray().element;
      if (element.mutable_ == Immutable) {
        return Super::visitArrayGet(curr);
      }
    }

    // Otherwise, we've failed to precompute.
    return Flow(NONCONSTANT_FLOW);
  }